

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

void target_get_early_clobbered_hard_regs(MIR_insn_t insn,MIR_reg_t *hr1,MIR_reg_t *hr2)

{
  undefined4 uVar1;
  
  uVar1 = *(undefined4 *)&insn->field_0x18;
  *hr2 = 0xffffffff;
  *hr1 = 0xffffffff;
  switch(uVar1) {
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x74:
  case 0x75:
    *hr1 = 2;
    return;
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4f:
  case 0x50:
  case 0x51:
    *hr1 = 0;
    *hr2 = 2;
    return;
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 100:
  case 0x65:
  case 0x66:
  case 0x6b:
  case 0x6c:
  case 0x6d:
    *hr1 = 0;
  }
  return;
}

Assistant:

static void target_get_early_clobbered_hard_regs (MIR_insn_t insn, MIR_reg_t *hr1, MIR_reg_t *hr2) {
  MIR_insn_code_t code = insn->code;

  *hr1 = *hr2 = MIR_NON_VAR;
  if (code == MIR_DIV || code == MIR_UDIV || code == MIR_DIVS || code == MIR_UDIVS
      || code == MIR_MOD || code == MIR_UMOD || code == MIR_MODS || code == MIR_UMODS
      || code == MIR_UMULO || code == MIR_UMULOS) {
    *hr1 = DX_HARD_REG;
  } else if (code == MIR_FEQ || code == MIR_FNE || code == MIR_DEQ || code == MIR_DNE
             || code == MIR_LDEQ || code == MIR_LDNE) {
    *hr1 = AX_HARD_REG;
    *hr2 = DX_HARD_REG;
  } else if (code == MIR_FLT || code == MIR_FLE || code == MIR_FGT || code == MIR_FGE
             || code == MIR_DLT || code == MIR_DLE || code == MIR_DGT || code == MIR_DGE
             || code == MIR_LDLT || code == MIR_LDLE || code == MIR_LDGT || code == MIR_LDGE) {
    *hr1 = AX_HARD_REG;
  }
}